

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

void writeAltFmtO(FILE *outf,int showBegin,int showEnd,char *groupname,dotNode *(*results) [7],
                 int spike)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined *puVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  dotNode *pdVar10;
  
  pcVar7 = "";
  for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
    fprintf((FILE *)outf,"begin_object %s%d\n",(&PTR_anon_var_dwarf_117bc_0014bd50)[lVar6],
            (ulong)((showBegin == 0 && showEnd != 0) + 1));
    fwrite("mode solid\n",0xb,1,(FILE *)outf);
    for (lVar9 = 0; lVar9 != 0x72; lVar9 = lVar9 + 1) {
      pdVar10 = results[lVar9][lVar6];
      if (pdVar10 != (dotNode *)0x0) {
        pcVar7 = getColor((int)lVar9);
      }
      pcVar8 = "--none--";
      for (; pdVar10 != (dotNode *)0x0; pdVar10 = pdVar10->next) {
        if ((ColorGap == '\0') && (pcVar7 = "124", pdVar10->t != (atom *)0x0)) {
          pcVar7 = assignGapColorForO(pdVar10->gap,(int)lVar6);
        }
        if (pcVar7 != pcVar8) {
          fprintf((FILE *)outf,"colour %s\n",pcVar7);
          pcVar8 = pcVar7;
        }
        dVar1 = (pdVar10->loc).x;
        dVar2 = (pdVar10->loc).y;
        dVar3 = (pdVar10->loc).z;
        if ((int)lVar6 - 3U < 3 && spike != 0) {
          fprintf((FILE *)outf,"move %.3f %.3f %.3f\nline %.3f %.3f %.3f\n",dVar1,dVar2,dVar3,
                  (pdVar10->spike).x,(pdVar10->spike).y,(pdVar10->spike).z);
        }
        else {
          fprintf((FILE *)outf,"sphere_xyz %.3f %.3f %.3f 0.03\n",dVar1,dVar2,dVar3);
        }
      }
    }
    fwrite("end_object\n",0xb,1,(FILE *)outf);
  }
  if (showEnd != 0) {
    if (showBegin == 0) {
      fwrite("begin_object contsurf\n",0x16,1,(FILE *)outf);
    }
    else {
      fprintf((FILE *)outf,"begin_object %s\n",groupname);
    }
    for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
      puVar4 = (&PTR_anon_var_dwarf_117bc_0014bd50)[lVar6];
      for (uVar5 = 1; uVar5 - (2 - (uint)(showBegin != 0 && showEnd != 0)) != 1; uVar5 = uVar5 + 1)
      {
        fprintf((FILE *)outf,"instance %s%d\n",puVar4,(ulong)uVar5);
      }
    }
    fwrite("end_object\n",0xb,1,(FILE *)outf);
    return;
  }
  return;
}

Assistant:

void writeAltFmtO(FILE *outf, int showBegin, int showEnd,
      char* groupname, dotNode *results[][NODEWIDTH], int spike)
{
   int i, j, numGroups, gn;
   dotNode *node;
   char *color = "", *prevColor = "";
   //Old: char *mast[NODEWIDTH] = {"WC", "CC", "SO", "BO", "HB"};
   char *mast[NODEWIDTH] = {"WC", "CC", "WH", "SO", "BO", "WO", "HB"}; /* 04/15/2015 SJ changed to match new NODEWIDTH, see probe.h*/
    
   numGroups = (showBegin && showEnd) ? 1 : 2;
   gn = (!showBegin && showEnd) ? 2 : 1;

   for (j = 0; j < NODEWIDTH; j++) {
      fprintf(outf, "begin_object %s%d\n", mast[j], gn);
      fprintf(outf, "mode solid\n");

      for (i = 0; i < NUMATOMTYPES; i++) {
	 prevColor = "--none--";
	 node = results[i][j];
	 if (node) {
	    color = convertKinColorToXV(getColor(i));
	 }
	 while(node) {
	    if (ColorGap) {
	       if (node->t) {
		  color = assignGapColorForO(node->gap, j);
	       }
	       else { color = "124";}
	    }
	    if (color != prevColor) {
	       fprintf(outf, "colour %s\n", color);
	       prevColor = color;
	    }
	    if ((j == 3 || j == 4 || j ==5) && spike) {/* bump */ /* 04/15/2015 SJ changed j numbers to match new ones for so, bo, and wo*/
	       fprintf(outf,
		  "move %.3f %.3f %.3f\nline %.3f %.3f %.3f\n",
		  node->loc.x, node->loc.y, node->loc.z,
		  node->spike.x, node->spike.y, node->spike.z);
	    }
	    else {/* contact or H-bond */
	       fprintf(outf, "sphere_xyz %.3f %.3f %.3f 0.03\n",
		  node->loc.x, node->loc.y, node->loc.z);
	    }
	    node = node->next;
	 }
      }
      fprintf(outf, "end_object\n");
   }

   if (showEnd) {
      if (showBegin) { fprintf(outf, "begin_object %s\n", groupname); }
      else           { fprintf(outf, "begin_object contsurf\n"); }
      for (j = 0; j < NODEWIDTH; j++) {
	 for (i = 0; i < numGroups; i++) {
	    fprintf(outf, "instance %s%d\n", mast[j], i+1);
	 }
      }
      fprintf(outf, "end_object\n");
   }
}